

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.h
# Opt level: O0

bool wasm::Match::
     matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>>
               (Expression *expr,
               Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
               matcher)

{
  bool bVar1;
  Expression *expr_local;
  
  bVar1 = Internal::
          Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
          ::matches(&matcher,expr);
  return bVar1;
}

Assistant:

inline bool matches(Expression* expr, Matcher matcher) {
  return matcher.matches(expr);
}